

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_flags_decoder.c
# Opt level: O0

lzma_ret lzma_filter_flags_decode
                   (lzma_filter *filter,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                   size_t in_size)

{
  lzma_ret ret__1;
  lzma_ret ret_;
  lzma_ret ret;
  lzma_vli props_size;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_filter *filter_local;
  
  filter->options = (void *)0x0;
  props_size = in_size;
  in_size_local = (size_t)in_pos;
  in_pos_local = (size_t *)in;
  in_local = (uint8_t *)allocator;
  allocator_local = (lzma_allocator *)filter;
  filter_local._4_4_ = lzma_vli_decode(&filter->id,(size_t *)0x0,in,in_pos,in_size);
  if (filter_local._4_4_ == LZMA_OK) {
    if (allocator_local->alloc < (_func_void_ptr_void_ptr_size_t_size_t *)0x4000000000000000) {
      filter_local._4_4_ =
           lzma_vli_decode((lzma_vli *)&ret_,(size_t *)0x0,(uint8_t *)in_pos_local,
                           (size_t *)in_size_local,props_size);
      if (filter_local._4_4_ == LZMA_OK) {
        if (props_size - *(long *)in_size_local < _ret_) {
          filter_local._4_4_ = LZMA_DATA_ERROR;
        }
        else {
          filter_local._4_4_ =
               lzma_properties_decode
                         ((lzma_filter *)allocator_local,(lzma_allocator *)in_local,
                          (uint8_t *)((long)in_pos_local + *(long *)in_size_local),_ret_);
          *(ulong *)in_size_local = _ret_ + *(long *)in_size_local;
        }
      }
    }
    else {
      filter_local._4_4_ = LZMA_DATA_ERROR;
    }
  }
  return filter_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filter_flags_decode(
		lzma_filter *filter, lzma_allocator *allocator,
		const uint8_t *in, size_t *in_pos, size_t in_size)
{
	lzma_vli props_size;
	lzma_ret ret;
	
	// Set the pointer to NULL so the caller can always safely free it.
	filter->options = NULL;

	// Filter ID
	return_if_error(lzma_vli_decode(&filter->id, NULL,
			in, in_pos, in_size));

	if (filter->id >= LZMA_FILTER_RESERVED_START)
		return LZMA_DATA_ERROR;

	// Size of Properties
	return_if_error(lzma_vli_decode(&props_size, NULL,
			in, in_pos, in_size));

	// Filter Properties
	if (in_size - *in_pos < props_size)
		return LZMA_DATA_ERROR;

	ret = lzma_properties_decode(
			filter, allocator, in + *in_pos, props_size);

	*in_pos += props_size;

	return ret;
}